

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testCRgba.cpp
# Opt level: O0

void anon_unknown.dwarf_20d0d3::convertImfRgbaToRgbaPixels
               (Array2D<ImfRgba> *ImfRgbaPixels,Array2D<Imf_3_4::Rgba> *RgbaPixels,int w,int h)

{
  ImfRgba *pIVar1;
  int in_ECX;
  int in_EDX;
  Array2D<Imf_3_4::Rgba> *in_RSI;
  Array2D<ImfRgba> *in_RDI;
  undefined4 uVar2;
  int x;
  int y;
  float in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd4;
  int local_20;
  int local_1c;
  
  for (local_1c = 0; local_1c < in_ECX; local_1c = local_1c + 1) {
    for (local_20 = 0; local_20 < in_EDX; local_20 = local_20 + 1) {
      pIVar1 = Imf_3_4::Array2D<ImfRgba>::operator[](in_RDI,(long)local_1c);
      uVar2 = ImfHalfToFloat(pIVar1[local_20].r);
      Imf_3_4::Array2D<Imf_3_4::Rgba>::operator[](in_RSI,(long)local_1c);
      Imath_3_2::half::operator=
                ((half *)CONCAT44(in_stack_ffffffffffffffd4,uVar2),in_stack_ffffffffffffffcc);
      pIVar1 = Imf_3_4::Array2D<ImfRgba>::operator[](in_RDI,(long)local_1c);
      in_stack_ffffffffffffffd4 = ImfHalfToFloat(pIVar1[local_20].g);
      Imf_3_4::Array2D<Imf_3_4::Rgba>::operator[](in_RSI,(long)local_1c);
      Imath_3_2::half::operator=
                ((half *)CONCAT44(in_stack_ffffffffffffffd4,uVar2),in_stack_ffffffffffffffcc);
      pIVar1 = Imf_3_4::Array2D<ImfRgba>::operator[](in_RDI,(long)local_1c);
      ImfHalfToFloat(pIVar1[local_20].b);
      Imf_3_4::Array2D<Imf_3_4::Rgba>::operator[](in_RSI,(long)local_1c);
      Imath_3_2::half::operator=
                ((half *)CONCAT44(in_stack_ffffffffffffffd4,uVar2),in_stack_ffffffffffffffcc);
      pIVar1 = Imf_3_4::Array2D<ImfRgba>::operator[](in_RDI,(long)local_1c);
      ImfHalfToFloat(pIVar1[local_20].a);
      Imf_3_4::Array2D<Imf_3_4::Rgba>::operator[](in_RSI,(long)local_1c);
      Imath_3_2::half::operator=
                ((half *)CONCAT44(in_stack_ffffffffffffffd4,uVar2),in_stack_ffffffffffffffcc);
    }
  }
  return;
}

Assistant:

void 
convertImfRgbaToRgbaPixels (const Array2D<ImfRgba>& ImfRgbaPixels,
                            Array2D<Rgba>& RgbaPixels, 
                            int w, 
                            int h)
{
    for (int y = 0; y < h; ++y)
    {
        for (int x = 0; x < w; ++x)
        {
            RgbaPixels[y][x].r = ImfHalfToFloat (ImfRgbaPixels[y][x].r);
            RgbaPixels[y][x].g = ImfHalfToFloat (ImfRgbaPixels[y][x].g);
            RgbaPixels[y][x].b = ImfHalfToFloat (ImfRgbaPixels[y][x].b);
            RgbaPixels[y][x].a = ImfHalfToFloat (ImfRgbaPixels[y][x].a);
        }
    }
}